

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.c
# Opt level: O0

DH * d2i_DHxparams(DH **a,uchar **pp,long length)

{
  int_dhx942_dh *ptr;
  uchar *seed;
  int_dhx942_dh **in_RDX;
  undefined8 *in_RDI;
  size_t counter;
  DH *dh;
  int_dhx942_dh *dhx;
  FFC_PARAMS *params;
  BIGNUM *in_stack_ffffffffffffffb8;
  FFC_PARAMS *in_stack_ffffffffffffffc0;
  long len;
  uchar **in_stack_ffffffffffffffd8;
  DH *local_8;
  
  len = 0;
  local_8 = (DH *)DH_new();
  if (local_8 == (DH *)0x0) {
    local_8 = (DH *)0x0;
  }
  else {
    ptr = d2i_int_dhx(in_RDX,in_stack_ffffffffffffffd8,len);
    if (ptr == (int_dhx942_dh *)0x0) {
      DH_free((DH *)local_8);
      local_8 = (DH *)0x0;
    }
    else {
      if (in_RDI != (undefined8 *)0x0) {
        DH_free((DH *)*in_RDI);
        *in_RDI = local_8;
      }
      DH_set0_pqg(local_8,(BIGNUM *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                  (BIGNUM *)0x3b6a31);
      ossl_ffc_params_set0_j(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (ptr->vparams != (int_dhvparams *)0x0) {
        seed = (uchar *)BN_get_word((BIGNUM *)ptr->vparams->counter);
        ossl_ffc_params_set_validate_params
                  ((FFC_PARAMS *)local_8,seed,(size_t)in_stack_ffffffffffffffb8,0);
        ASN1_BIT_STRING_free((ASN1_BIT_STRING *)ptr->vparams->seed);
        BN_free((BIGNUM *)ptr->vparams->counter);
        CRYPTO_free(ptr->vparams);
        ptr->vparams = (int_dhvparams *)0x0;
      }
      CRYPTO_free(ptr);
      DH_clear_flags(local_8,0xf000);
      DH_set_flags(local_8,0x1000);
    }
  }
  return local_8;
}

Assistant:

DH *d2i_DHxparams(DH **a, const unsigned char **pp, long length)
{
    FFC_PARAMS *params;
    int_dhx942_dh *dhx = NULL;
    DH *dh = NULL;

    dh = DH_new();
    if (dh == NULL)
        return NULL;
    dhx = d2i_int_dhx(NULL, pp, length);
    if (dhx == NULL) {
        DH_free(dh);
        return NULL;
    }

    if (a != NULL) {
        DH_free(*a);
        *a = dh;
    }

    params = &dh->params;
    DH_set0_pqg(dh, dhx->p, dhx->q, dhx->g);
    ossl_ffc_params_set0_j(params, dhx->j);

    if (dhx->vparams != NULL) {
        /* The counter has a maximum value of 4 * numbits(p) - 1 */
        size_t counter = (size_t)BN_get_word(dhx->vparams->counter);
        ossl_ffc_params_set_validate_params(params, dhx->vparams->seed->data,
                                            dhx->vparams->seed->length,
                                            counter);
        ASN1_BIT_STRING_free(dhx->vparams->seed);
        BN_free(dhx->vparams->counter);
        OPENSSL_free(dhx->vparams);
        dhx->vparams = NULL;
    }

    OPENSSL_free(dhx);
    DH_clear_flags(dh, DH_FLAG_TYPE_MASK);
    DH_set_flags(dh, DH_FLAG_TYPE_DHX);
    return dh;
}